

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ucum.cpp
# Opt level: O2

void __thiscall UCUM_TestRoundTrip2_Test::TestBody(UCUM_TestRoundTrip2_Test *this)

{
  bool bVar1;
  istream *piVar2;
  precise_unit *un;
  ostream *poVar3;
  uint64_t match_flags;
  char cVar4;
  char *pcVar5;
  int ceqFail;
  int ciFail;
  ulong local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  precise_unit uact;
  string genstring;
  precise_unit csact;
  string line;
  string local_278;
  string local_258;
  ifstream i;
  
  std::ifstream::ifstream
            (&i,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/example_ucum_codes.csv"
             ,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  ciFail = 0;
  ceqFail = 0;
  line.field_2._M_local_buf[0] = '\0';
  local_320 = 0;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&i,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    cVar4 = (char)&line;
    std::__cxx11::string::find(cVar4,0x2c);
    std::__cxx11::string::find(cVar4,0x2c);
    std::__cxx11::string::substr((ulong)&ustring,(ulong)&line);
    match_flags = 0xffffffffffffffff;
    std::__cxx11::string::substr((ulong)&name,(ulong)&line);
    std::__cxx11::string::string((string *)&local_258,(string *)&ustring);
    csact = units::unit_from_string(&local_258,7);
    std::__cxx11::string::~string((string *)&local_258);
    un = (precise_unit *)units::getDefaultFlags();
    units::to_string_abi_cxx11_(&genstring,(units *)&csact,un,match_flags);
    std::__cxx11::string::string((string *)&local_278,(string *)&genstring);
    uact = units::unit_from_string(&local_278,7);
    std::__cxx11::string::~string((string *)&local_278);
    if ((NAN(uact.multiplier_)) || (uact.base_units_ == (unit_data)0xfa94a488)) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&ustring);
      poVar3 = std::operator<<(poVar3,"->");
      poVar3 = std::operator<<(poVar3,(string *)&genstring);
      poVar3 = std::operator<<(poVar3," does not result in a valid ustring unit for ");
      poVar3 = std::operator<<(poVar3,(string *)&name);
      std::operator<<(poVar3,'\n');
      ciFail = (int)local_320 + 1;
      local_320 = (ulong)(uint)ciFail;
    }
    bVar1 = units::precise_unit::operator!=(&uact,&csact);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&genstring);
      poVar3 = std::operator<<(poVar3," and ");
      poVar3 = std::operator<<(poVar3,(string *)&ustring);
      poVar3 = std::operator<<(poVar3," do not produce the same unit ");
      poVar3 = std::operator<<(poVar3,(string *)&name);
      std::operator<<(poVar3,'\n');
      ceqFail = ceqFail + 1;
    }
    std::__cxx11::string::~string((string *)&genstring);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&ustring);
  }
  if (0 < ceqFail) {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,ceqFail);
    std::operator<<(poVar3,"test unit name mismatches between unit and description\n");
  }
  name._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>((internal *)&ustring,"ceqFail","0",&ceqFail,(int *)&name);
  if ((char)ustring._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&name);
    if (ustring._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)ustring._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&genstring,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp",
               0x243,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&genstring,(Message *)&name);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&genstring);
    if ((long *)CONCAT44(name._M_dataplus._M_p._4_4_,name._M_dataplus._M_p._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(name._M_dataplus._M_p._4_4_,name._M_dataplus._M_p._0_4_) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ustring._M_string_length);
  name._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>((internal *)&ustring,"ciFail","0",&ciFail,(int *)&name);
  if ((char)ustring._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&name);
    if (ustring._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)ustring._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&genstring,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp",
               0x244,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&genstring,(Message *)&name);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&genstring);
    if ((long *)CONCAT44(name._M_dataplus._M_p._4_4_,name._M_dataplus._M_p._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(name._M_dataplus._M_p._4_4_,name._M_dataplus._M_p._0_4_) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ustring._M_string_length);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&i);
  return;
}

Assistant:

TEST(UCUM, TestRoundTrip2)
{
    std::ifstream i(TEST_FILE_FOLDER "/example_ucum_codes.csv");
    std::string line;
    int ciFail = 0;
    int ceqFail = 0;
    while (std::getline(i, line)) {
        auto fc = line.find_first_of(',');
        auto fc2 = line.find_first_of(',', fc + 1);
        auto ustring = line.substr(fc + 1, fc2 - fc - 1);
        auto name = line.substr(fc2 + 1);
        auto csact = units::unit_from_string(ustring, units::strict_ucum);
        std::string genstring = to_string(csact);
        auto uact = units::unit_from_string(genstring, units::strict_ucum);

        if (is_error(uact)) {
            std::cout << ustring << "->" << genstring
                      << " does not result in a valid ustring unit for " << name
                      << '\n';

            ++ciFail;
            // units::unit_from_string(ustring);
            // to_string(csact);
        }

        if (uact != csact) {
            std::cout << genstring << " and " << ustring
                      << " do not produce the same unit " << name << '\n';
            ++ceqFail;
        }
    }
    if (ceqFail > 0) {
        std::cout << ceqFail
                  << "test unit name mismatches between unit and description\n";
    }
    EXPECT_EQ(ceqFail, 0);
    EXPECT_EQ(ciFail, 0);
}